

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1133::run(TestCase1133 *this)

{
  word **this_00;
  bool bVar1;
  char *__s;
  size_t __n;
  ArrayPtr<const_capnp::word> *pAVar2;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  __off_t extraout_RDX_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ReaderFor<capnp::Text> RVar4;
  char local_336 [2];
  bool local_334;
  char local_333 [2];
  DebugExpression<char> local_331;
  undefined1 local_330 [4];
  bool _kj_shouldLog_5;
  DebugComparison<char,_char> _kjCondition_5;
  char local_306 [2];
  uint i_1;
  undefined1 local_300 [4];
  bool _kj_shouldLog_4;
  DebugComparison<char,_char> _kjCondition_4;
  char *pcStack_2d8;
  uint i;
  char *local_2d0;
  bool local_2c1;
  char *pcStack_2c0;
  bool _kj_shouldLog_3;
  char *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [8];
  DebugComparison<char_*,_const_char_*> _kjCondition_3;
  int local_278;
  bool local_271;
  size_t sStack_270;
  bool _kj_shouldLog_2;
  int local_268;
  DebugExpression<int> local_264;
  undefined1 local_260 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_2;
  ReaderFor<capnp::Text> reader;
  size_t local_218;
  int local_210;
  bool local_209;
  undefined1 auStack_208 [7];
  bool _kj_shouldLog_1;
  size_t local_200;
  size_t local_1f8;
  int local_1f0;
  DebugExpression<int> local_1ec;
  undefined1 local_1e8 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  size_t local_1b0;
  int local_1a8;
  bool local_1a1;
  undefined1 auStack_1a0 [7];
  bool _kj_shouldLog;
  size_t local_198;
  size_t local_190;
  int local_188;
  DebugExpression<int> local_184;
  undefined1 local_180 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  BuilderFor<capnp::Text> builder;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Text> orphan;
  MallocMessageBuilder message;
  TestCase1133 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  Orphanage::newOrphan<capnp::Text>((Orphan<capnp::Text> *)local_120,&local_130,0x11);
  Orphan<capnp::Text>::get
            ((BuilderFor<capnp::Text> *)&_kjCondition.result,(Orphan<capnp::Text> *)local_120);
  __s = Text::Builder::begin((Builder *)&_kjCondition.result);
  __n = Text::Builder::size((Builder *)&_kjCondition.result);
  memset(__s,0x61,__n);
  local_188 = 4;
  local_184 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_188);
  _auStack_1a0 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_1a0,0);
  local_190 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_180,&local_184,&local_190);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
  __length = extraout_RDX;
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    __length = extraout_RDX_00;
    while (local_1a1 != false) {
      local_1a8 = 4;
      AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      _kjCondition_1._32_8_ = AVar3.ptr;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition_1.result
                          ,0);
      local_1b0 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x473,ERROR,
                 "\"failed: expected \" \"(4) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 4, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (4) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_180,&local_1a8,&local_1b0);
      __length = extraout_RDX_01;
      local_1a1 = false;
    }
  }
  Orphan<capnp::Text>::truncate((Orphan<capnp::Text> *)local_120,(char *)0x1b,__length);
  local_1f0 = 5;
  local_1ec = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f0);
  _auStack_208 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
  pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)auStack_208,0);
  local_1f8 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_1e8,&local_1ec,&local_1f8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_209 = kj::_::Debug::shouldLog(ERROR);
    while (local_209 != false) {
      local_210 = 5;
      AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&orphan.builder.location);
      reader.super_StringPtr.content.size_ = (size_t)AVar3.ptr;
      pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)
                          &reader.super_StringPtr.content.size_,0);
      local_218 = kj::ArrayPtr<const_capnp::word>::size(pAVar2);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x475,ERROR,
                 "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
                 ,(char (*) [67])
                  "failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
                 (DebugComparison<int,_unsigned_long> *)local_1e8,&local_210,&local_218);
      local_209 = false;
    }
  }
  RVar4 = Orphan<capnp::Text>::getReader((Orphan<capnp::Text> *)local_120);
  reader.super_StringPtr.content.ptr = RVar4.super_StringPtr.content.size_;
  _kjCondition_2._32_8_ = RVar4.super_StringPtr.content.ptr;
  local_268 = 0x1b;
  local_264 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_268);
  sStack_270 = kj::StringPtr::size((StringPtr *)&_kjCondition_2.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_260,&local_264,&stack0xfffffffffffffd90);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
  if (!bVar1) {
    local_271 = kj::_::Debug::shouldLog(ERROR);
    while (local_271 != false) {
      local_278 = 0x1b;
      _kjCondition_3._32_8_ = kj::StringPtr::size((StringPtr *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x478,ERROR,
                 "\"failed: expected \" \"(27) == (reader.size())\", _kjCondition, 27, reader.size()"
                 ,(char (*) [41])"failed: expected (27) == (reader.size())",
                 (DebugComparison<int,_unsigned_long> *)local_260,&local_278,
                 (unsigned_long *)&_kjCondition_3.result);
      local_271 = false;
    }
  }
  local_2b8 = Text::Builder::begin((Builder *)&_kjCondition.result);
  local_2b0 = (char *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2b8);
  pcStack_2c0 = kj::StringPtr::begin((StringPtr *)&_kjCondition_2.result);
  kj::_::DebugExpression<char*>::operator==
            ((DebugComparison<char_*,_const_char_*> *)local_2a8,(DebugExpression<char*> *)&local_2b0
             ,&stack0xfffffffffffffd40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      local_2d0 = Text::Builder::begin((Builder *)&_kjCondition.result);
      pcStack_2d8 = kj::StringPtr::begin((StringPtr *)&_kjCondition_2.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char*,char_const*>&,char*,char_const*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x479,ERROR,
                 "\"failed: expected \" \"(builder.begin()) == (reader.begin())\", _kjCondition, builder.begin(), reader.begin()"
                 ,(char (*) [55])"failed: expected (builder.begin()) == (reader.begin())",
                 (DebugComparison<char_*,_const_char_*> *)local_2a8,&local_2d0,
                 &stack0xfffffffffffffd28);
      local_2c1 = false;
    }
  }
  for (_kjCondition_4._28_4_ = 0; (uint)_kjCondition_4._28_4_ < 0x11;
      _kjCondition_4._28_4_ = _kjCondition_4._28_4_ + 1) {
    i_1._2_1_ = 0x61;
    i_1._3_1_ = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char *)((long)&i_1 + 2));
    i_1._1_1_ = kj::StringPtr::operator[]
                          ((StringPtr *)&_kjCondition_2.result,(ulong)(uint)_kjCondition_4._28_4_);
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char> *)local_300,(DebugExpression<char> *)((long)&i_1 + 3),
               (char *)((long)&i_1 + 1));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_300);
    if (!bVar1) {
      i_1._0_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)(undefined1)i_1 != false) {
        local_306[1] = 0x61;
        local_306[0] = kj::StringPtr::operator[]
                                 ((StringPtr *)&_kjCondition_2.result,
                                  (ulong)(uint)_kjCondition_4._28_4_);
        kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<char,char>&,char,char>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x47c,ERROR,
                   "\"failed: expected \" \"(\'a\') == (reader[i])\", _kjCondition, \'a\', reader[i]"
                   ,(char (*) [38])"failed: expected (\'a\') == (reader[i])",
                   (DebugComparison<char,_char> *)local_300,local_306 + 1,local_306);
        i_1._0_1_ = false;
      }
    }
  }
  for (_kjCondition_5._28_4_ = 0x11; (uint)_kjCondition_5._28_4_ < 0x1b;
      _kjCondition_5._28_4_ = _kjCondition_5._28_4_ + 1) {
    local_333[1] = 0;
    local_331 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_333 + 1);
    local_333[0] = kj::StringPtr::operator[]
                             ((StringPtr *)&_kjCondition_2.result,(ulong)(uint)_kjCondition_5._28_4_
                             );
    kj::_::DebugExpression<char>::operator==
              ((DebugComparison<char,_char> *)local_330,&local_331,local_333);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
    if (!bVar1) {
      local_334 = kj::_::Debug::shouldLog(ERROR);
      while (local_334 != false) {
        local_336[1] = 0;
        local_336[0] = kj::StringPtr::operator[]
                                 ((StringPtr *)&_kjCondition_2.result,
                                  (ulong)(uint)_kjCondition_5._28_4_);
        kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char>&,char,char>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x47f,ERROR,
                   "\"failed: expected \" \"(\'\\\\0\') == (reader[i])\", _kjCondition, \'\\0\', reader[i]"
                   ,(char (*) [39])"failed: expected (\'\\0\') == (reader[i])",
                   (DebugComparison<char,_char> *)local_330,local_336 + 1,local_336);
        local_334 = false;
      }
    }
  }
  Orphan<capnp::Text>::~Orphan((Orphan<capnp::Text> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, ExtendText) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Text>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 'a', builder.size());

  EXPECT_EQ(4, message.getSegmentsForOutput()[0].size());
  orphan.truncate(27);
  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_EQ(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ('a', reader[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ('\0', reader[i]);
  }
}